

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool isRotationMatrix(Mat *R)

{
  _InputArray *p_Var1;
  double dVar2;
  _InputArray local_460;
  _InputArray local_448;
  MatExpr local_430 [352];
  MatExpr local_2d0 [8];
  Mat I;
  Mat local_270 [352];
  MatExpr local_110 [8];
  Mat shouldBeIdentity;
  _OutputArray local_b0;
  _InputArray local_88;
  Mat local_70 [8];
  Mat Rt;
  Mat *R_local;
  
  cv::Mat::Mat(local_70);
  cv::_InputArray::_InputArray(&local_88,R);
  cv::_OutputArray::_OutputArray(&local_b0,local_70);
  cv::transpose(&local_88,&local_b0);
  cv::_OutputArray::~_OutputArray(&local_b0);
  cv::_InputArray::~_InputArray(&local_88);
  cv::operator*(local_270,local_70);
  cv::MatExpr::operator_cast_to_Mat(local_110);
  cv::MatExpr::~MatExpr((MatExpr *)local_270);
  cv::Mat::type((Mat *)local_110);
  cv::Mat::eye((int)local_430,3,3);
  cv::MatExpr::operator_cast_to_Mat(local_2d0);
  cv::MatExpr::~MatExpr(local_430);
  cv::_InputArray::_InputArray(&local_448,(Mat *)local_2d0);
  cv::_InputArray::_InputArray(&local_460,(Mat *)local_110);
  p_Var1 = (_InputArray *)cv::noArray();
  dVar2 = (double)cv::norm(&local_448,&local_460,4,p_Var1);
  cv::_InputArray::~_InputArray(&local_460);
  cv::_InputArray::~_InputArray(&local_448);
  cv::Mat::~Mat((Mat *)local_2d0);
  cv::Mat::~Mat((Mat *)local_110);
  cv::Mat::~Mat(local_70);
  return dVar2 < 1e-06;
}

Assistant:

bool isRotationMatrix(cv::Mat &R)
{
    cv::Mat Rt;
    transpose(R, Rt);
    cv::Mat shouldBeIdentity = Rt * R;
    cv::Mat I = cv::Mat::eye(3,3, shouldBeIdentity.type());
     
    return  norm(I, shouldBeIdentity) < 1e-6;
     
}